

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consist.c
# Opt level: O2

void consistency(void)

{
  Item *pIVar1;
  Item *pIVar2;
  bool bVar3;
  List *pLVar4;
  Symbol *pSVar5;
  List *pLVar6;
  long lVar7;
  uint uVar8;
  
  if ((scop_indep != indepsym) && (scop_indep->subtype == 6)) {
    scop_indep->subtype = 4;
  }
  bVar3 = false;
  for (lVar7 = 0x41; lVar7 != 0x7b; lVar7 = lVar7 + 1) {
    pLVar4 = symlist[lVar7];
    pLVar6 = pLVar4;
    while (pLVar6 = pLVar6->next, pLVar6 != pLVar4) {
      pIVar1 = (pLVar6->element).itm;
      if (pIVar1->itemtype == 0x13e) {
        pIVar2 = (pIVar1->element).itm;
        if ((Item *)0x1 < pIVar2 && ((ulong)pIVar2 & 1) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"KEYWORD");
          bVar3 = true;
        }
        uVar8 = (uint)pIVar2;
        if (((ulong)pIVar2 & 0xffffffffff2b7fff) != 0 && ((ulong)pIVar2 & 0xd48000) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"RESERVED WORD");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xfffffffffff7ffff) != 0 && (uVar8 >> 0x13 & 1) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"CONSTANT");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xffffffffffffffdd) != 0 && ((ulong)pIVar2 & 2) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"PARAMETER");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xffffffffffffffd7) != 0 && ((ulong)pIVar2 & 8) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"ASSIGNED");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xfffffffffffffffb) != 0 && ((ulong)pIVar2 & 4) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"INDEPENDENT");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xffffffffffffffcf) != 0 && ((ulong)pIVar2 & 0x10) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"STATE");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xffffffffffffffbf) != 0 && ((ulong)pIVar2 & 0x40) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"FUNCTION");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xffffffffffffff7f) != 0 && (char)pIVar2 < '\0') {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"PROCEDURE");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xfffffffffffffdff) != 0 && (uVar8 >> 9 & 1) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"DERIVATIVE");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xfffffffffffffbff) != 0 && (uVar8 >> 10 & 1) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm," KINETIC");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xfffffffffffeffff) != 0 && (uVar8 >> 0x10 & 1) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"LINEAR");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xfffffffffffff7ff) != 0 && (uVar8 >> 0xb & 1) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"NONLINEAR");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xffffffffffffefff) != 0 && (uVar8 >> 0xc & 1) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"DISCRETE");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xffffffffffffbfff) != 0 && (uVar8 >> 0xe & 1) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"PARTIAL");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xffffffffffffdfff) != 0 && (uVar8 >> 0xd & 1) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"STEPPED");
          bVar3 = true;
        }
        if (((ulong)pIVar2 & 0xfffffffffffdffff) != 0 && (uVar8 >> 0x11 & 1) != 0) {
          fprintf(_stderr,"%s is a %s\n",pIVar1[2].element.itm,"CONSTANT UNITS FACTOR");
          bVar3 = true;
        }
        uVar8 = *(uint *)((long)&pIVar1[1].next + 4);
        if ((~uVar8 & 0x48) == 0) {
          diag(pIVar1[2].element.str," used as both variable and function");
        }
        if (uVar8 != 0 && pIVar2 == (Item *)0x0) {
          fprintf(_stderr,"Warning: %s undefined. (declared within VERBATIM?)\n",
                  pIVar1[2].element.itm);
        }
      }
      pLVar4 = symlist[lVar7];
    }
  }
  if (bVar3) {
    diag("multiple uses for same variable",(char *)0x0);
  }
  if (indepsym != (Symbol *)0x0) {
    lVar7 = 0x41;
    do {
      if (lVar7 == 0x7b) {
        return;
      }
      pLVar4 = symlist[lVar7];
      pLVar6 = pLVar4;
      while (pLVar6 = pLVar6->next, pLVar6 != pLVar4) {
        pIVar1 = (pLVar6->element).itm;
        if ((((pIVar1->itemtype == 0x13e) && (((ulong)pIVar1->element & 0x10) != 0)) &&
            (*pIVar1[2].element.str == 'D')) &&
           (((pSVar5 = lookup(pIVar1[2].element.str + 1), pSVar5 != (Symbol *)0x0 &&
             (pIVar1->itemtype == 0x13e)) && (((ulong)pIVar1->element & 0x10) != 0)))) {
          fprintf(_stderr,"%s is a STATE so %s is a %s\' and",pSVar5->name,pIVar1[2].element.itm,
                  pSVar5->name);
          diag(" cannot be declared as a STATE\n",(char *)0x0);
        }
        pLVar4 = symlist[lVar7];
      }
      lVar7 = lVar7 + 1;
    } while( true );
  }
  diag("Independent variable is not defined",(char *)0x0);
}

Assistant:

void consistency()
{
	Symbol         *s;
	Item           *qs;
	int             i, tu, err = 0;
	long            t;


	/* the scop_indep can also be a automatic parameter */
	if (scop_indep != indepsym && scop_indep->subtype == (PARM | INDEP)) {
		scop_indep->subtype = INDEP;
	}
	
	SYMITER(NAME) {
		t = s->subtype;
		con("KEYWORD", KEYWORD, 0);
		con("RESERVED WORD", EXTDEF|EXTDEF2|EXTDEF3|EXTDEF4|EXTDEF5, 0);
		con("CONSTANT", nmodlCONST, 0);
		con("PARAMETER", PARM, ARRAY);
		con("ASSIGNED", DEP, ARRAY);
		con("INDEPENDENT", INDEP, 0);
		con("STATE", STAT, ARRAY);
		con("FUNCTION", FUNCT, 0);
		con("PROCEDURE", PROCED, 0);
		con("DERIVATIVE", DERF, 0);
		con(" KINETIC", KINF, 0);
		con("LINEAR", LINF, 0);
		con("NONLINEAR", NLINF, 0);
		con("DISCRETE", DISCF, 0);
		con("PARTIAL", PARF, 0);
		con("STEPPED", STEP1, 0);
		con("CONSTANT UNITS FACTOR", UNITDEF, 0);
		tu = s->usage;
		if ((tu & DEP) && (tu & FUNCT))
			diag(s->name, " used as both variable and function");
		if ((t == 0) && tu)
			Fprintf(stderr,
				"Warning: %s undefined. (declared within VERBATIM?)\n", s->name);
	}
	if (err) {
		diag("multiple uses for same variable", (char *) 0);
	}
	if (indepsym == SYM0) {
		diag("Independent variable is not defined", (char *)0);
	}
	/* avoid the problem where person inadvertently is using Dstate as a state*/
	SYMITER(NAME) {
		if ((s->subtype & STAT) && (s->name[0] == 'D')) {
			Symbol* s1 = lookup(s->name + 1);
			if (s1 && s->type == NAME && (s->subtype & STAT)) {
fprintf(stderr, "%s is a STATE so %s is a %s' and", s1->name, s->name, s1->name);
diag(" cannot be declared as a STATE\n", (char*)0);
			}
		}
	}
}